

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall sznet::TimerQueue::addTimerInLoop(TimerQueue *this,Timer *timer)

{
  uint uVar1;
  uint32_t hole_index;
  EventLoop *this_00;
  bool bVar2;
  pair<std::_Rb_tree_iterator<std::pair<sznet::Timer_*,_long>_>,_bool> pVar3;
  pair<sznet::Timer_*,_long> local_38;
  
  this_00 = this->m_loop;
  bVar2 = net::EventLoop::isInLoopThread(this_00);
  if (!bVar2) {
    net::EventLoop::abortNotInLoopThread(this_00);
  }
  uVar1 = (this->m_timerMinHeap).m_size;
  if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count != (ulong)uVar1) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x46,"void sznet::TimerQueue::addTimerInLoop(Timer *)");
  }
  MinHeap<sznet::Timer>::reserve(&this->m_timerMinHeap,uVar1 + 1);
  hole_index = (this->m_timerMinHeap).m_size;
  (this->m_timerMinHeap).m_size = hole_index + 1;
  MinHeap<sznet::Timer>::shiftUp_(&this->m_timerMinHeap,hole_index,timer);
  local_38.second = timer->m_sequence;
  local_38.first = timer;
  pVar3 = std::
          _Rb_tree<std::pair<sznet::Timer*,long>,std::pair<sznet::Timer*,long>,std::_Identity<std::pair<sznet::Timer*,long>>,std::less<std::pair<sznet::Timer*,long>>,std::allocator<std::pair<sznet::Timer*,long>>>
          ::_M_insert_unique<std::pair<sznet::Timer*,long>>
                    ((_Rb_tree<std::pair<sznet::Timer*,long>,std::pair<sznet::Timer*,long>,std::_Identity<std::pair<sznet::Timer*,long>>,std::less<std::pair<sznet::Timer*,long>>,std::allocator<std::pair<sznet::Timer*,long>>>
                      *)&this->m_activeTimers,&local_38);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __assert_fail("result.second",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x49,"void sznet::TimerQueue::addTimerInLoop(Timer *)");
  }
  if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (ulong)(this->m_timerMinHeap).m_size) {
    return;
  }
  __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                ,0x4a,"void sznet::TimerQueue::addTimerInLoop(Timer *)");
}

Assistant:

void TimerQueue::addTimerInLoop(Timer* timer)
{
	m_loop->assertInLoopThread();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	m_timerMinHeap.push(timer);
	std::pair<ActiveTimerSet::iterator, bool> result = m_activeTimers.insert(ActiveTimer(timer, timer->sequence()));
	assert(result.second); (void)result;
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}